

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

char * faup_output_get_string_from_url_type(faup_handler_t *fh)

{
  ulong uVar1;
  
  uVar1 = (ulong)(fh->faup).url_type;
  if (uVar1 < 5) {
    return &DAT_0011c530 + *(int *)(&DAT_0011c530 + uVar1 * 4);
  }
  faup_output_get_string_from_url_type_cold_1();
  return "error";
}

Assistant:

char *faup_output_get_string_from_url_type(faup_handler_t const* fh)
{
  switch (fh->faup.url_type) {
  case FAUP_URL_HAS_NO_TLD:
    return "no_tld";
    break;
  case FAUP_URL_HAS_MOZILLA_TLD:
    return "mozilla_tld";
    break;
  case FAUP_URL_HAS_UNKNOWN_TLD:
    return "unknown_tld";
    break;
  case FAUP_URL_IPV4:
    return "ipv4";
    break;
  case FAUP_URL_IPV6:
    return "ipv6";
    break;
  default:
    fprintf(stderr, "Woops, we should never be here: cannot guess the faup url type in the output!\n");
    return "error";
    break;
  }

    return "error";
}